

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall hwnet::util::TimerMgr::swap(TimerMgr *this,size_t idx1,size_t idx2)

{
  value_type pTVar1;
  value_type pTVar2;
  size_t __n;
  size_t __n_00;
  reference ppTVar3;
  value_type e;
  size_t offset2;
  size_t offset1;
  size_t idx2_local;
  size_t idx1_local;
  TimerMgr *this_local;
  
  if (idx1 != idx2) {
    __n = getOffset(this,idx1);
    __n_00 = getOffset(this,idx2);
    ppTVar3 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n);
    pTVar1 = *ppTVar3;
    ppTVar3 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n_00);
    pTVar2 = *ppTVar3;
    ppTVar3 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n);
    *ppTVar3 = pTVar2;
    ppTVar3 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n_00);
    *ppTVar3 = pTVar1;
    ppTVar3 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n);
    (*ppTVar3)->mIndex = idx1;
    ppTVar3 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n_00);
    (*ppTVar3)->mIndex = idx2;
  }
  return;
}

Assistant:

void swap(size_t idx1, size_t idx2) {
		if(idx1 != idx2) {
			auto offset1 = getOffset(idx1);
			auto offset2 = getOffset(idx2);
			auto e = this->elements[offset1];
			this->elements[offset1] = this->elements[offset2];
			this->elements[offset2] = e;
			this->elements[offset1]->mIndex = idx1;
			this->elements[offset2]->mIndex = idx2;
		}
	}